

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

void __thiscall crnlib::mipmapped_texture::discard_mips(mipmapped_texture *this)

{
  uint uVar1;
  vector<crnlib::mip_level_*> *pvVar2;
  long in_RDI;
  uint l;
  uint f;
  uint i;
  uint uVar3;
  uint i_00;
  
  uVar3 = 0;
  while( true ) {
    i_00 = uVar3;
    uVar1 = vector<crnlib::vector<crnlib::mip_level_*>_>::size
                      ((vector<crnlib::vector<crnlib::mip_level_*>_> *)(in_RDI + 0x20));
    if (uVar1 <= uVar3) break;
    pvVar2 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                       ((vector<crnlib::vector<crnlib::mip_level_*>_> *)(in_RDI + 0x20),i_00);
    uVar1 = vector<crnlib::mip_level_*>::size(pvVar2);
    if (1 < uVar1) {
      uVar3 = 1;
      while( true ) {
        i = uVar3;
        pvVar2 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                           ((vector<crnlib::vector<crnlib::mip_level_*>_> *)(in_RDI + 0x20),i_00);
        uVar1 = vector<crnlib::mip_level_*>::size(pvVar2);
        if (uVar1 <= uVar3) break;
        pvVar2 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                           ((vector<crnlib::vector<crnlib::mip_level_*>_> *)(in_RDI + 0x20),i_00);
        vector<crnlib::mip_level_*>::operator[](pvVar2,i);
        crnlib_delete<crnlib::mip_level>((mip_level *)0x16df6c);
        uVar3 = i + 1;
      }
      vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                ((vector<crnlib::vector<crnlib::mip_level_*>_> *)(in_RDI + 0x20),i_00);
      vector<crnlib::mip_level_*>::resize
                ((vector<crnlib::mip_level_*> *)CONCAT44(i_00,i),(uint)((ulong)in_RDI >> 0x20),
                 SUB81((ulong)in_RDI >> 0x18,0));
    }
    uVar3 = i_00 + 1;
  }
  return;
}

Assistant:

void mipmapped_texture::discard_mips() {
  for (uint f = 0; f < m_faces.size(); f++) {
    if (m_faces[f].size() > 1) {
      for (uint l = 1; l < m_faces[f].size(); l++)
        crnlib_delete(m_faces[f][l]);

      m_faces[f].resize(1);
    }
  }

  CRNLIB_ASSERT(check());
}